

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

bool __thiscall
phmap::priv::anon_unknown_0::SubstringLess::operator()(SubstringLess *this,string *a,string *b)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  string *local_20;
  string *b_local;
  string *a_local;
  SubstringLess *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (string *)this;
  local_40 = (basic_string_view<char,_std::char_traits<char>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)a);
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_40,0,(long)this->n);
  local_60 = (basic_string_view<char,_std::char_traits<char>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
  local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_60,0,(long)this->n);
  bVar1 = std::operator<(local_30,local_50);
  return bVar1;
}

Assistant:

bool operator()(const std::string &a, const std::string &b) const {
#if PHMAP_HAVE_STD_STRING_VIEW
            return std::string_view(a).substr(0, n) <
                std::string_view(b).substr(0, n);
#else
            return a.substr(0, n) < b.substr(0, n);
#endif
        }